

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilerbug_tests.cpp
# Opt level: O0

void __thiscall compilerbug_tests::gccbug_90348::test_method(gccbug_90348 *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  int j;
  int i;
  uchar in [4];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_ffffffffffffff18;
  lazy_ostream *in_stack_ffffffffffffff20;
  assertion_result *in_stack_ffffffffffffff28;
  const_string *msg;
  lazy_ostream *in_stack_ffffffffffffff48;
  const_string *in_stack_ffffffffffffff50;
  unit_test_log_t *in_stack_ffffffffffffff58;
  int local_a0;
  int local_9c;
  const_string local_90 [2];
  lazy_ostream local_70 [2];
  int local_4c;
  assertion_result local_48;
  const_string local_30 [2];
  undefined1 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_9c = 0; local_9c < 5; local_9c = local_9c + 1) {
    for (local_a0 = 0; local_a0 < local_9c; local_a0 = local_a0 + 1) {
      local_c[local_a0] = 0;
      set_one_on_stack();
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffff28,
                 (pointer)in_stack_ffffffffffffff20,(unsigned_long)in_stack_ffffffffffffff18);
      msg = local_30;
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffff18);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 (size_t)in_stack_ffffffffffffff48,msg);
      local_4c = check_zero((uchar *)in_stack_ffffffffffffff20,
                            (uint)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      boost::test_tools::assertion_result::assertion_result<int>
                (in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20);
      in_stack_ffffffffffffff48 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffff28,
                 (pointer)in_stack_ffffffffffffff20,(unsigned_long)in_stack_ffffffffffffff18);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffff20,(basic_cstring<const_char> *)in_stack_ffffffffffffff18);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffff28,
                 (pointer)in_stack_ffffffffffffff20,(unsigned_long)in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff18 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_48,local_70,local_90,0x25,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_ffffffffffffff18);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffff18);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(gccbug_90348) {
    // Test for GCC bug 90348. See https://gcc.gnu.org/bugzilla/show_bug.cgi?id=90348
    for (int i = 0; i <= 4; ++i) {
        unsigned char in[4];
        for (int j = 0; j < i; ++j) {
            in[j] = 0;
            set_one_on_stack(); // Apparently modifies in[0]
        }
        BOOST_CHECK(check_zero(in, i));
    }
}